

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O1

void __thiscall TilePool::debugPrintInfo(TilePool *this)

{
  source_loc loc;
  source_loc loc_00;
  logger *plVar1;
  pointer puVar2;
  uint *args_1;
  string_view_t fmt;
  string_view_t fmt_00;
  unsigned_long local_50 [4];
  _Base_bitset<1UL> local_30;
  
  local_50[0] = (long)(this->items_).
                      super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->items_).
                      super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
  plVar1 = spdlog::default_logger_raw();
  local_50[3] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x20;
  fmt.data_ = "TilePool info: pool has {} items";
  spdlog::logger::log_<unsigned_long>(plVar1,loc,debug,fmt,local_50);
  local_50[0] = 0;
  puVar2 = (this->items_).
           super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->items_).
      super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    do {
      args_1 = (this->itemsAllocatedCount_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + local_50[0];
      local_30._M_w =
           ((puVar2[local_50[0]]._M_t.
             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>.
             _M_t.
             super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
             super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl)->allocated).
           super__Base_bitset<1UL>._M_w;
      plVar1 = spdlog::default_logger_raw();
      local_50[1] = 0;
      local_50[2] = 0;
      local_50[3] = 0;
      loc_00.funcname = (char *)0x0;
      loc_00.filename = (char *)0x0;
      loc_00.line = 0;
      loc_00._12_4_ = 0;
      fmt_00.size_ = 0x21;
      fmt_00.data_ = "  item {}: {} allocated, {:#018x}";
      spdlog::logger::log_<unsigned_long&,unsigned_int&,unsigned_long_long>
                (plVar1,loc_00,debug,fmt_00,local_50,args_1,&local_30._M_w);
      local_50[0] = local_50[0] + 1;
      puVar2 = (this->items_).
               super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (local_50[0] <
             (ulong)((long)(this->items_).
                           super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  return;
}

Assistant:

void TilePool::debugPrintInfo() {
    /*spdlog::debug("TilePool info: pool has {} items, baseId = {}, upperId = {}", items_.size(), baseId_, upperId_);
    for (size_t i = 0; i < items_.size(); ++i) {
        if (items_[i] == nullptr) {
            spdlog::debug("  item {}: null", i);
        } else {
            spdlog::debug("  item {}: {} allocated", i, items_[i]->allocatedCount);
        }
    }*/

    spdlog::debug("TilePool info: pool has {} items", items_.size());
    for (size_t i = 0; i < items_.size(); ++i) {
        spdlog::debug("  item {}: {} allocated, {:#018x}", i, itemsAllocatedCount_[i], items_[i]->allocated.to_ullong());
    }
}